

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O3

string * __thiscall anurbs::Entry<anurbs::Brep>::type_name_abi_cxx11_(Entry<anurbs::Brep> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x70657242;
  in_RDI->_M_string_length = 4;
  (in_RDI->field_2)._M_local_buf[4] = '\0';
  return in_RDI;
}

Assistant:

std::string type_name() const override
    {
        return TData::type_name();
    }